

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::coin_grinder_tests::test_method(coin_grinder_tests *this)

{
  long lVar1;
  CFeeRate long_term_feerate;
  bool bVar2;
  T *a;
  SelectionResult *b;
  long in_FS_OFFSET;
  CFeeRate *in_stack_ffffffffffffec68;
  FastRandomContext *this_00;
  undefined8 in_stack_ffffffffffffec70;
  lazy_ostream *prev;
  undefined4 in_stack_ffffffffffffec78;
  undefined4 uVar3;
  int in_stack_ffffffffffffec7c;
  uint in_stack_ffffffffffffec84;
  _Optional_payload_base<int> __pos;
  CFeeRate in_stack_ffffffffffffec90;
  undefined7 in_stack_ffffffffffffec98;
  undefined1 in_stack_ffffffffffffec9f;
  CFeeRate in_stack_ffffffffffffeca0;
  _Optional_payload_base<int> in_stack_ffffffffffffeca8;
  SelectionResult *in_stack_ffffffffffffecb0;
  undefined8 in_stack_ffffffffffffecb8;
  int nInput;
  CAmount *in_stack_ffffffffffffecc0;
  int in_stack_ffffffffffffece0;
  undefined4 in_stack_ffffffffffffece4;
  undefined8 in_stack_ffffffffffffece8;
  int max_selection_weight_00;
  NodeContext *in_stack_ffffffffffffecf0;
  CoinSelectionParams *in_stack_ffffffffffffecf8;
  CoinSelectionParams *cs_params;
  undefined4 in_stack_ffffffffffffed00;
  undefined4 in_stack_ffffffffffffed04;
  undefined4 uVar4;
  SelectionResult *in_stack_ffffffffffffed30;
  SelectionResult *in_stack_ffffffffffffed38;
  Result<wallet::SelectionResult> *res_6;
  int max_selection_weight_6;
  Result<wallet::SelectionResult> *res_5;
  int max_selection_weight_5;
  Result<wallet::SelectionResult> *res_4;
  int max_selection_weight_4;
  Result<wallet::SelectionResult> *res_3;
  int max_selection_weight_3;
  Result<wallet::SelectionResult> *res_2;
  int max_selection_weight_2;
  Result<wallet::SelectionResult> *res_1;
  int max_selection_weight_1;
  Result<wallet::SelectionResult> *res;
  int max_selection_weight;
  coin_grinder_tests *this_local;
  const_string local_fe0;
  const_string *local_fd0;
  lazy_ostream local_fc8 [2];
  assertion_result local_fa8 [2];
  size_t expected_attempts_4;
  const_string local_f68 [2];
  lazy_ostream local_f48 [2];
  assertion_result local_f28 [2];
  undefined8 local_ef0;
  undefined8 local_ee8;
  CAmount target_6;
  const_string local_eb0;
  size_t local_ea0;
  lazy_ostream local_e98 [2];
  assertion_result local_e78 [2];
  size_t expected_attempts_3;
  const_string local_e38 [2];
  lazy_ostream local_e18 [2];
  assertion_result local_df8 [2];
  undefined8 local_dc0;
  undefined8 local_db8;
  undefined8 local_db0;
  undefined8 local_da8;
  CAmount target_5;
  const_string local_d70;
  size_t local_d60;
  lazy_ostream local_d58 [2];
  assertion_result local_d38 [2];
  size_t expected_attempts_2;
  const_string local_cf8 [2];
  lazy_ostream local_cd8 [2];
  assertion_result local_cb8 [2];
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  const_string local_c68 [2];
  lazy_ostream local_c48 [2];
  assertion_result local_c28 [4];
  CAmount target_4;
  const_string local_bc0;
  size_t local_bb0;
  lazy_ostream local_ba8 [2];
  assertion_result local_b88 [2];
  size_t expected_attempts_1;
  const_string local_b48 [2];
  lazy_ostream local_b28 [2];
  assertion_result local_b08 [2];
  undefined8 local_ad0;
  undefined8 local_ac8;
  CAmount target_3;
  const_string local_a90;
  size_t local_a80;
  lazy_ostream local_a78 [2];
  assertion_result local_a58 [2];
  size_t expected_attempts;
  const_string local_a18 [2];
  lazy_ostream local_9f8 [2];
  assertion_result local_9d8 [4];
  CAmount target_2;
  const_string local_970 [2];
  lazy_ostream local_950 [2];
  assertion_result local_930 [2];
  const_string local_8f8 [2];
  lazy_ostream local_8d8 [2];
  assertion_result local_8b8 [4];
  CAmount target_1;
  const_string local_850 [2];
  lazy_ostream local_830 [2];
  assertion_result local_810 [2];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [2];
  assertion_result local_798 [4];
  CAmount target;
  lazy_ostream *local_730;
  FastRandomContext *local_728;
  _Optional_payload_base<int> local_718;
  CoinSelectionParams dummy_params;
  SelectionResult expected_result_3;
  SelectionResult expected_result_2;
  SelectionResult expected_result_1;
  SelectionResult expected_result;
  FastRandomContext rand;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_ffffffffffffec7c,in_stack_ffffffffffffec78),
             SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffec68,0);
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffec68,0);
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffec68,0);
  std::optional<int>::optional((optional<int> *)&local_718);
  uVar3 = 0x2c;
  long_term_feerate.nSatoshisPerK._7_1_ = in_stack_ffffffffffffec9f;
  long_term_feerate.nSatoshisPerK._0_7_ = in_stack_ffffffffffffec98;
  CoinSelectionParams::CoinSelectionParams
            ((CoinSelectionParams *)local_718,
             (FastRandomContext *)((ulong)in_stack_ffffffffffffec84 << 0x20),
             in_stack_ffffffffffffec7c,0x2c,(CAmount)local_730,in_stack_ffffffffffffeca0,
             long_term_feerate,in_stack_ffffffffffffec90,in_stack_ffffffffffffece0,
             SUB81((ulong)local_728 >> 0x38,0),(optional<int>)in_stack_ffffffffffffeca8);
  target = 4950000000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__0,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)local_730);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)local_728);
  this_00 = local_728;
  prev = local_730;
  __pos = local_718;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result::operator_cast_to_bool((Result<wallet::SelectionResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_798,local_7b8,local_7d8,0x47b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::ErrorString<wallet::SelectionResult>
              ((Result<wallet::SelectionResult> *)in_stack_ffffffffffffeca0.nSatoshisPerK);
    bilingual_str::empty((bilingual_str *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_810,local_830,local_850,0x47c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bilingual_str::~bilingual_str((bilingual_str *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_1 = 2950000000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__1,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result::operator_cast_to_bool((Result<wallet::SelectionResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8d8,local_8f8,0x48d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::ErrorString<wallet::SelectionResult>
              ((Result<wallet::SelectionResult> *)in_stack_ffffffffffffeca0.nSatoshisPerK);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (char *)in_stack_ffffffffffffec90.nSatoshisPerK,(size_type)__pos);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_930,local_950,local_970,0x48e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bilingual_str::~bilingual_str((bilingual_str *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_2 = 0x96fa8340;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__2,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    boost::test_tools::assertion_result::assertion_result<util::Result<wallet::SelectionResult>>
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               (Result<wallet::SelectionResult> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9d8,local_9f8,local_a18,0x4a1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_attempts = 0x25;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_a80 = SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_ffffffffffffeca8,
               (unsigned_long *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98));
    boost::unit_test::operator<<
              (prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a58,local_a78,&local_a90,0x4a4,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_3 = 190000000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__3,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  SelectionResult::SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(CAmount)prev,
             (SelectionAlgorithm)((ulong)this_00 >> 0x38));
  local_ac8 = 100000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_ad0 = 100000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator*((Result<wallet::SelectionResult> *)this_00);
    EquivalentResult(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b08,local_b28,local_b48,0x4b7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_attempts_1 = 3;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_bb0 = SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_ffffffffffffeca8,
               (unsigned_long *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98));
    boost::unit_test::operator<<
              (prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_b88,local_ba8,&local_bc0,0x4ba,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SelectionResult::~SelectionResult((SelectionResult *)this_00);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_4 = 3000000000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__4,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    boost::test_tools::assertion_result::assertion_result<util::Result<wallet::SelectionResult>>
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               (Result<wallet::SelectionResult> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c28,local_c48,local_c68,0x4cf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SelectionResult::SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(CAmount)prev,
             (SelectionAlgorithm)((ulong)this_00 >> 0x38));
  local_c70 = 1400000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_c78 = 1300000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_c80 = 400000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator*((Result<wallet::SelectionResult> *)this_00);
    EquivalentResult(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cb8,local_cd8,local_cf8,0x4d4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_attempts_2 = 0x5c;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_d60 = SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_ffffffffffffeca8,
               (unsigned_long *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98));
    boost::unit_test::operator<<
              (prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_d38,local_d58,&local_d70,0x4d7,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SelectionResult::~SelectionResult((SelectionResult *)this_00);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_5 = 989999999;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__5,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20),
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  SelectionResult::SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(CAmount)prev,
             (SelectionAlgorithm)((ulong)this_00 >> 0x38));
  local_da8 = 400000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_db0 = 300000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_db8 = 200000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  local_dc0 = 100000000;
  add_coin(in_stack_ffffffffffffecc0,(int)((ulong)in_stack_ffffffffffffecb8 >> 0x20),
           in_stack_ffffffffffffecb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator*((Result<wallet::SelectionResult> *)this_00);
    EquivalentResult(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_df8,local_e18,local_e38,0x4fb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_attempts_3 = 0x26;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    a = util::Result<wallet::SelectionResult>::operator->
                  ((Result<wallet::SelectionResult> *)this_00);
    b = (SelectionResult *)SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    local_ea0 = SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_ffffffffffffeca8,
               (unsigned_long *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98));
    boost::unit_test::operator<<
              (prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_e78,local_e98,&local_eb0,0x4fe,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    nInput = (int)((ulong)in_stack_ffffffffffffecb8 >> 0x20);
    max_selection_weight_00 = (int)((ulong)in_stack_ffffffffffffece8 >> 0x20);
  } while (bVar2);
  SelectionResult::~SelectionResult((SelectionResult *)this_00);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  target_6 = 190000000;
  cs_params = (CoinSelectionParams *)
              &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup
               .super_BasicTestingSetup.m_node;
  uVar4 = 40000;
  std::function<wallet::CoinsResult(wallet::CWallet&)>::
  function<wallet::coinselector_tests::coin_grinder_tests::test_method()::__6,void>
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)
             CONCAT44(in_stack_ffffffffffffec7c,uVar3),(anon_class_1_0_00000001 *)prev);
  CoinGrinder((CAmount *)CONCAT44(uVar4,in_stack_ffffffffffffed00),cs_params,
              in_stack_ffffffffffffecf0,max_selection_weight_00,
              (function<wallet::CoinsResult_(wallet::CWallet_&)> *)
              CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0));
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::~function
            ((function<wallet::CoinsResult_(wallet::CWallet_&)> *)this_00);
  SelectionResult::SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(CAmount)prev,
             (SelectionAlgorithm)((ulong)this_00 >> 0x38));
  local_ee8 = 100000000;
  add_coin(in_stack_ffffffffffffecc0,nInput,in_stack_ffffffffffffecb0);
  local_ef0 = 100000000;
  add_coin(in_stack_ffffffffffffecc0,nInput,in_stack_ffffffffffffecb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator*((Result<wallet::SelectionResult> *)this_00);
    EquivalentResult(a,b);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f28,local_f48,local_f68,0x515,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_attempts_4 = 7;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90.nSatoshisPerK);
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)this_00);
    SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),
               SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    in_stack_ffffffffffffeca8 =
         (_Optional_payload_base<int>)
         util::Result<wallet::SelectionResult>::operator->
                   ((Result<wallet::SelectionResult> *)this_00);
    in_stack_ffffffffffffeca0.nSatoshisPerK =
         SelectionResult::GetSelectionsEvaluated((SelectionResult *)this_00);
    local_fd0 = (const_string *)in_stack_ffffffffffffeca0.nSatoshisPerK;
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_ffffffffffffeca8,
               (unsigned_long *)in_stack_ffffffffffffeca0.nSatoshisPerK,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffec9f,in_stack_ffffffffffffec98));
    boost::unit_test::operator<<
              (prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_ffffffffffffec7c,uVar3),(pointer)prev,
               (unsigned_long)this_00);
    this_00 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_fa8,local_fc8,&local_fe0,0x518,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_ffffffffffffec9f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffec9f);
  SelectionResult::~SelectionResult((SelectionResult *)this_00);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_00);
  FastRandomContext::~FastRandomContext(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(coin_grinder_tests)
{
    // Test Coin Grinder:
    // 1) Insufficient funds, select all provided coins and fail.
    // 2) Exceeded max weight, coin selection always surpasses the max allowed weight.
    // 3) Select coins without surpassing the max weight (some coins surpasses the max allowed weight, some others not)
    // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
    // 5) Test finding a solution in a UTXO pool with mixed weights
    // 6) Test that the lightest solution among many clones is found
    // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead

    FastRandomContext rand;
    CoinSelectionParams dummy_params{ // Only used to provide the 'avoid_partial' flag.
            rand,
            /*change_output_size=*/34,
            /*change_spend_size=*/68,
            /*min_change_target=*/CENT,
            /*effective_feerate=*/CFeeRate(5000),
            /*long_term_feerate=*/CFeeRate(2000),
            /*discard_feerate=*/CFeeRate(1000),
            /*tx_noinputs_size=*/10 + 34, // static header size + output size
            /*avoid_partial=*/false,
    };

    {
        // #########################################################
        // 1) Insufficient funds, select all provided coins and fail
        // #########################################################
        CAmount target = 49.5L * COIN;
        int max_selection_weight = 10'000; // high enough to not fail for this reason.
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN));
                add_coin(available_coins, wallet, CAmount(2 * COIN));
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).empty()); // empty means "insufficient funds"
    }

    {
        // ###########################
        // 2) Test max weight exceeded
        // ###########################
        CAmount target = 29.5L * COIN;
        int max_selection_weight = 3000;
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true);
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).original.find("The inputs size exceeds the maximum weight") != std::string::npos);
    }

    {
        // ###############################################################################################################
        // 3) Test selection when some coins surpass the max allowed weight while others not. --> must find a good solution
        // ################################################################################################################
        CAmount target = 25.33L * COIN;
        int max_selection_weight = 10'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 60; ++j) { // 60 UTXO --> 19,8 BTC total --> 60 × 272 WU = 16320 WU
                add_coin(available_coins, wallet, CAmount(0.33 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            for (int i = 0; i < 10; i++) { // 10 UTXO --> 20 BTC total --> 10 × 272 WU = 2720 WU
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 37;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 148);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 3;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // ###############################################################################################################
        // 5) Test finding a solution in a UTXO pool with mixed weights
        // ################################################################################################################
        CAmount target = 30L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 5; ++j) {
                // Add heavy coins {3, 6, 9, 12, 15}
                add_coin(available_coins, wallet, CAmount((3 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 350);
                // Add medium coins {2, 5, 8, 11, 14}
                add_coin(available_coins, wallet, CAmount((2 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 250);
                // Add light coins {1, 4, 7, 10, 13}
                add_coin(available_coins, wallet, CAmount((1 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 150);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(14 * COIN, 1, expected_result);
        add_coin(13 * COIN, 2, expected_result);
        add_coin(4 * COIN, 3, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 92;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 6) Test that the lightest solution among many clones is found
        // #################################################################################################################
        CAmount target =  9.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            // Expected Result: 4 + 3 + 2 + 1 = 10 BTC at 400 vB
            add_coin(available_coins, wallet, CAmount(4 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(3 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            // Distracting clones:
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(8 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(7 * COIN), CFeeRate(5000), 144, false, 0, true, 800);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(6 * COIN), CFeeRate(5000), 144, false, 0, true, 600);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(5 * COIN), CFeeRate(5000), 144, false, 0, true, 400);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(4 * COIN, 0, expected_result);
        add_coin(3 * COIN, 0, expected_result);
        add_coin(2 * COIN, 0, expected_result);
        add_coin(1 * COIN, 0, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 38;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 40000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(1.8 * COIN), CFeeRate(5000), 144, false, 0, true, 2500);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            for (int j = 0; j < 100; ++j) {
                // make a 100 unique coins only differing by one sat
                add_coin(available_coins, wallet, CAmount(0.01 * COIN + j), CFeeRate(5000), 144, false, 0, true, 110);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 7;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }
}